

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O3

void h2v1_merged_upsample_565
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  jpeg_upsampler *pjVar5;
  JSAMPLE *pJVar6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  long lVar8;
  _func_void_j_decompress_ptr *p_Var9;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var10;
  ushort *puVar11;
  long lVar12;
  byte *pbVar13;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  byte *pbVar19;
  long lVar20;
  
  pjVar5 = cinfo->upsample;
  pJVar6 = cinfo->sample_range_limit;
  p_Var7 = pjVar5[1].upsample;
  lVar8 = *(long *)&pjVar5[1].need_context_rows;
  p_Var9 = pjVar5[2].start_pass;
  p_Var10 = pjVar5[2].upsample;
  pbVar13 = (*input_buf)[in_row_group_ctr];
  pbVar19 = input_buf[1][in_row_group_ctr];
  pbVar15 = input_buf[2][in_row_group_ctr];
  puVar11 = (ushort *)*output_buf;
  uVar4 = cinfo->output_width;
  if (1 < uVar4) {
    uVar16 = uVar4 >> 1;
    do {
      lVar20 = (long)*(int *)(p_Var7 + (ulong)*pbVar15 * 4);
      uVar14 = (ulong)*pbVar13;
      lVar18 = (long)(int)((ulong)(*(long *)(p_Var9 + (ulong)*pbVar15 * 8) +
                                  *(long *)(p_Var10 + (ulong)*pbVar19 * 8)) >> 0x10);
      lVar12 = (long)*(int *)(lVar8 + (ulong)*pbVar19 * 4);
      uVar17 = (ulong)pbVar13[1];
      bVar1 = pJVar6[lVar20 + uVar17];
      bVar2 = pJVar6[lVar18 + uVar17];
      bVar3 = pJVar6[lVar12 + uVar17];
      *puVar11 = (ushort)(pJVar6[uVar14 + lVar12] >> 3) |
                 (pJVar6[lVar20 + uVar14] & 0xfff8) * 0x100 + (pJVar6[uVar14 + lVar18] & 0xfc) * 8;
      puVar11[1] = (ushort)(bVar3 >> 3) | (bVar1 & 0xfff8) * 0x100 + (bVar2 & 0xfc) * 8;
      pbVar19 = pbVar19 + 1;
      pbVar15 = pbVar15 + 1;
      pbVar13 = pbVar13 + 2;
      puVar11 = puVar11 + 2;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  if ((uVar4 & 1) != 0) {
    uVar14 = (ulong)*pbVar13;
    *puVar11 = (ushort)(pJVar6[(long)*(int *)(lVar8 + (ulong)*pbVar19 * 4) + uVar14] >> 3) |
               (pJVar6[(long)*(int *)(p_Var7 + (ulong)*pbVar15 * 4) + uVar14] & 0xfff8) * 0x100 +
               (pJVar6[(long)(int)((ulong)(*(long *)(p_Var9 + (ulong)*pbVar15 * 8) +
                                          *(long *)(p_Var10 + (ulong)*pbVar19 * 8)) >> 0x10) +
                       uVar14] & 0xfc) * 8;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample_565(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                         JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v1_merged_upsample_565_be(cinfo, input_buf, in_row_group_ctr,
                                output_buf);
  else
    h2v1_merged_upsample_565_le(cinfo, input_buf, in_row_group_ctr,
                                output_buf);
}